

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O3

void __thiscall antlr::Parser::matchNot(Parser *this,int t)

{
  int iVar1;
  int numTokens_;
  MismatchedTokenException *this_00;
  undefined4 extraout_var;
  RefToken local_58;
  string local_50;
  
  iVar1 = (*this->_vptr_Parser[2])(this,1);
  if (iVar1 != t) {
    (*this->_vptr_Parser[0xc])(this);
    return;
  }
  this_00 = (MismatchedTokenException *)__cxa_allocate_exception(200);
  iVar1 = (*this->_vptr_Parser[0x19])(this);
  numTokens_ = (*this->_vptr_Parser[0x1a])(this);
  (*this->_vptr_Parser[3])(&local_58,this,1);
  (*this->_vptr_Parser[8])(&local_50,this);
  MismatchedTokenException::MismatchedTokenException
            (this_00,(char **)CONCAT44(extraout_var,iVar1),numTokens_,&local_58,t,true,&local_50);
  __cxa_throw(this_00,&MismatchedTokenException::typeinfo,
              MismatchedTokenException::~MismatchedTokenException);
}

Assistant:

virtual void matchNot(int t)
	{
		if ( LA(1)==t )
		{
			// Throws inverted-sense exception
			throw MismatchedTokenException(getTokenNames(), getNumTokens(), LT(1), t, true, getFilename());
		}
		else
		{
			// mark token as consumed -- fetch next token deferred until LA/LT
			consume();
		}
	}